

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall mp::NLFeeder_Easy::FillHeader(NLFeeder_Easy *this)

{
  char **ppcVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  
  (this->header_).super_NLInfo.super_NLInfo_C.format = (uint)((this->nlopt_).n_text_mode_ == 0);
  (this->header_).super_NLInfo.super_NLInfo_C.flags = (this->nlopt_).flags_;
  (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_var_name_len = 0;
  ppcVar1 = (this->nlme_).var_names_;
  if ((ppcVar1 != (char **)0x0) && (lVar6 = (long)(this->nlme_).vars_.num_col_, lVar6 != 0)) {
    iVar5 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_var_name_len;
    do {
      pcVar2 = ppcVar1[lVar6 + -1];
      if (pcVar2 != (char *)0x0) {
        sVar4 = strlen(pcVar2);
        iVar3 = (int)sVar4;
        if (iVar5 < iVar3) {
          (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_var_name_len = iVar3;
          iVar5 = iVar3;
        }
      }
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_con_name_len = 0;
  ppcVar1 = (this->nlme_).row_names_;
  if ((ppcVar1 != (char **)0x0) && (lVar6 = (long)(this->nlme_).num_row_, lVar6 != 0)) {
    iVar5 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_con_name_len;
    do {
      pcVar2 = ppcVar1[lVar6 + -1];
      if (pcVar2 != (char *)0x0) {
        sVar4 = strlen(pcVar2);
        iVar3 = (int)sVar4;
        if (iVar5 < iVar3) {
          (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_con_name_len = iVar3;
          iVar5 = iVar3;
        }
      }
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  iVar5 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_con_name_len;
  sVar4 = strlen((this->nlme_).obj_name_);
  if (iVar5 < (int)sVar4) {
    (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_con_name_len = (int)sVar4;
  }
  iVar5 = (this->nlme_).num_row_;
  (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons = iVar5;
  (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros =
       (this->nlme_).A_.num_nz_;
  (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs = 1;
  (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_ranges = iVar5;
  (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars = (this->nlme_).vars_.num_col_;
  (this->header_).super_NLInfo.super_NLInfo_C.prob_name = (this->nlme_).prob_name_;
  return;
}

Assistant:

void FillHeader() {
    header_.format = nlopt_.n_text_mode_
        ? NL_FORMAT_TEXT : NL_FORMAT_BINARY;
    header_.flags = nlopt_.flags_;

    header_.max_var_name_len = 0;
    if (auto pn = NLME().ColNames())
      for (auto i=NLME().NumCols(); i--; )
        if (pn[i]
            && header_.max_var_name_len<(int)std::strlen(pn[i]))
          header_.max_var_name_len=(int)std::strlen(pn[i]);
    header_.max_con_name_len = 0;
    if (auto pn = NLME().RowNames())
      for (auto i=NLME().NumRows(); i--; )
        if (pn[i]
            && header_.max_con_name_len<(int)std::strlen(pn[i]))
          header_.max_con_name_len=(int)std::strlen(pn[i]);
    if (header_.max_con_name_len<(int)std::strlen(NLME().ObjName()))
      header_.max_con_name_len=(int)std::strlen(NLME().ObjName());

    header_.num_algebraic_cons = NLME().NumRows();
    // Need number of Jacobian nonzeros.
    // For linear constraints, it's just those in A.
    header_.num_con_nonzeros = NLME().GetA().num_nz_;
    // (Non)linear binary/int vars,
    // num_obj_nonzeros filled before
    // ...

    header_.num_objs = 1;
    header_.num_ranges = NLME().NumRows();
    header_.num_vars = NLME().NumCols();
    header_.prob_name = NLME().ProbName();
  }